

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

void opj_destroy_cstr_info(opj_codestream_info_t *cstr_info)

{
  undefined8 *puVar1;
  long in_RDI;
  opj_tile_info_t *tile_info;
  int tileno;
  int local_c;
  
  if (in_RDI != 0) {
    for (local_c = 0; local_c < *(int *)(in_RDI + 0x2c) * *(int *)(in_RDI + 0x30);
        local_c = local_c + 1) {
      puVar1 = (undefined8 *)(*(long *)(in_RDI + 0x68) + (long)local_c * 0x260);
      free((void *)*puVar1);
      free((void *)puVar1[0x45]);
      free((void *)puVar1[0x4b]);
      free((void *)puVar1[0x49]);
    }
    free(*(void **)(in_RDI + 0x68));
    free(*(void **)(in_RDI + 0x50));
    free(*(void **)(in_RDI + 0x40));
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_destroy_cstr_info(opj_codestream_info_t *cstr_info) {
	if (cstr_info) {
		int tileno;
		for (tileno = 0; tileno < cstr_info->tw * cstr_info->th; tileno++) {
			opj_tile_info_t *tile_info = &cstr_info->tile[tileno];
			opj_free(tile_info->thresh);
			opj_free(tile_info->packet);
			opj_free(tile_info->tp);
			opj_free(tile_info->marker);
		}
		opj_free(cstr_info->tile);
		opj_free(cstr_info->marker);
		opj_free(cstr_info->numdecompos);
	}
}